

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

void __thiscall ON_SerialNumberMap::Dump(ON_SerialNumberMap *this,ON_TextLog *text_log)

{
  size_t i;
  ulong uVar1;
  
  ON_TextLog::Print(text_log,"m_maxsn = %d\n",this->m_private->m_maxsn);
  ON_TextLog::Print(text_log,"m_sn_count = %d\n",this->m_sn_count);
  ON_TextLog::Print(text_log,"m_sn_purged = %d\n",this->m_sn_purged);
  ON_TextLog::Print(text_log,"m_active_id_count = %d\n",this->m_sn_purged);
  ON_TextLog::Print(text_log,"m_bHashTableIsValid = %d\n",(ulong)this->m_bHashTableIsValid);
  ON_TextLog::Print(text_log,"m_snblk_list_capacity = %d\n",this->m_snblk_list_capacity);
  ON_TextLog::Print(text_log,"m_snblk_list_count = %d\n",this->m_snblk_list_count);
  ON_TextLog::Print(text_log,"m_sn_block0\n");
  ON_TextLog::PushIndent(text_log);
  ON_SN_BLOCK::Dump(this->m_sn_block0,text_log);
  ON_TextLog::PopIndent(text_log);
  for (uVar1 = 0; uVar1 < this->m_snblk_list_count; uVar1 = uVar1 + 1) {
    ON_TextLog::Print(text_log,"m_snblk_list[%d]\n",uVar1);
    ON_TextLog::PushIndent(text_log);
    ON_SN_BLOCK::Dump(this->m_snblk_list[uVar1],text_log);
    ON_TextLog::PopIndent(text_log);
  }
  return;
}

Assistant:

void ON_SerialNumberMap::Dump(ON_TextLog& text_log) const
{
  text_log.Print("m_maxsn = %d\n", m_private->MaxSn());
  text_log.Print("m_sn_count = %d\n",m_sn_count);
  text_log.Print("m_sn_purged = %d\n",m_sn_purged);
  text_log.Print("m_active_id_count = %d\n",m_sn_purged);
  text_log.Print("m_bHashTableIsValid = %d\n",m_bHashTableIsValid);
  text_log.Print("m_snblk_list_capacity = %d\n",m_snblk_list_capacity);
  text_log.Print("m_snblk_list_count = %d\n",m_snblk_list_count);
  
  text_log.Print("m_sn_block0\n");
  text_log.PushIndent();
  m_sn_block0.Dump(text_log);
  text_log.PopIndent();

  for ( size_t i = 0; i < m_snblk_list_count; i++ )
  {
    text_log.Print("m_snblk_list[%d]\n",i);
    text_log.PushIndent();
    m_snblk_list[i]->Dump(text_log);
    text_log.PopIndent();
  }
}